

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
ft::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,value_type *val)

{
  size_t in_RDX;
  ulong uVar1;
  
  uVar1 = this->m_size;
  if (this->m_capacity <= uVar1) {
    realloc(this,(void *)(this->m_capacity * 2),in_RDX);
    uVar1 = this->m_size;
  }
  std::__cxx11::string::string((string *)(this->m_data + uVar1),(string *)val);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}